

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

void __thiscall
PossibleContentsTest_TestOracleMinimal_Test::TestBody
          (PossibleContentsTest_TestOracleMinimal_Test *this)

{
  Location location;
  Location location_00;
  char *message;
  char *in_R9;
  undefined1 local_148 [8];
  ContentOracle oracle;
  Name local_e8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  size_t local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_5_9943fe1e_for_Literal_0 local_80;
  undefined8 local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  undefined1 local_50 [8];
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> wasm;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&oracle.locationContents._M_h._M_single_bucket,
             "\n    (module\n      (global $null (ref null any) (ref.null any))\n      (global $something i32 (i32.const 42))\n    )\n  "
             ,(allocator<char> *)local_148);
  parse((string *)local_50);
  std::__cxx11::string::~string((string *)&oracle.locationContents._M_h._M_single_bucket);
  ::wasm::ContentOracle::ContentOracle((ContentOracle *)local_148,(Module *)local_50);
  ::wasm::Name::Name(&local_80.func,"null");
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._4_4_ = local_80.i64._4_4_;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._0_4_ = local_80.i32;
  pcStack_d0 = local_80.func.super_IString.str._M_str;
  local_b8 = 4;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._33_7_ = uStack_b7;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_index = 4;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._8_8_ = local_80.func.super_IString.str._M_str;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._16_8_ = local_c8;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._24_8_ = uStack_c0;
  ::wasm::ContentOracle::getContents((PossibleContents *)&wasm,(ContentOracle *)local_148,location);
  local_68[0] = ::wasm::PossibleContents::isNull((PossibleContents *)&wasm);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)&wasm);
  if ((internal)local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80.func);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&wasm,(internal *)local_68,
               (AssertionResult *)"oracle.getContents(GlobalLocation{\"null\"}).isNull()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/possible-contents.cpp"
               ,0x11c,(char *)wasm._M_t.
                              super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                              .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_80.func);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&wasm);
    if ((long *)CONCAT44(local_80.i64._4_4_,local_80.i32) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80.i64._4_4_,local_80.i32) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  ::wasm::Name::Name(&local_e8,"something");
  local_a8 = local_e8.super_IString.str._M_len;
  pcStack_a0 = local_e8.super_IString.str._M_str;
  local_88 = 4;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._33_7_ = uStack_87;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_index = 4;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._8_8_ = local_e8.super_IString.str._M_str;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._M_first._M_storage.expr = (Expression *)local_e8.super_IString.str._M_len;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._16_8_ = local_98;
  location_00.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._24_8_ = uStack_90;
  ::wasm::ContentOracle::getContents
            ((PossibleContents *)&wasm,(ContentOracle *)local_148,location_00);
  ::wasm::PossibleContents::getLiteral((Literal *)local_68,(PossibleContents *)&wasm);
  local_80.i32 = 0x2a;
  local_70 = 2;
  testing::internal::CmpHelperEQ<wasm::Literal,wasm::Literal>
            ((internal *)&local_28,"oracle.getContents(GlobalLocation{\"something\"}).getLiteral()",
             "Literal(int32_t(42))",(Literal *)local_68,(Literal *)&local_80.func);
  ::wasm::Literal::~Literal((Literal *)&local_80.func);
  ::wasm::Literal::~Literal((Literal *)local_68);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)&wasm);
  if (local_28.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&wasm);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/possible-contents.cpp"
               ,0x120,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&wasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)
        wasm._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x0) {
      (**(code **)(*(long *)wasm._M_t.
                            super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                            .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&oracle);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_50);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestOracleMinimal) {
  // A minimal test of the public API of PossibleTypesOracle. See the lit test
  // for coverage of all the internals (using lit makes the result more
  // fuzzable).
  auto wasm = parse(R"(
    (module
      (global $null (ref null any) (ref.null any))
      (global $something i32 (i32.const 42))
    )
  )");
  ContentOracle oracle(*wasm);

  // This will be a null constant.
  EXPECT_TRUE(oracle.getContents(GlobalLocation{"null"}).isNull());

  // This will be 42.
  EXPECT_EQ(oracle.getContents(GlobalLocation{"something"}).getLiteral(),
            Literal(int32_t(42)));
}